

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int archive_read_format_rar_bid(archive_read *a,int best_bid)

{
  byte bVar1;
  long in_RAX;
  int *piVar2;
  void *pvVar3;
  int iVar4;
  size_t min;
  ulong uVar5;
  long lVar6;
  ssize_t window;
  ulong uVar7;
  ssize_t bytes_avail;
  long local_38;
  
  iVar4 = -1;
  if ((best_bid < 0x1f) &&
     (local_38 = in_RAX, piVar2 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0),
     piVar2 != (int *)0x0)) {
    if (*(int *)((long)piVar2 + 3) == 0x71a21 && *piVar2 == 0x21726152) {
      iVar4 = 0x1e;
    }
    else {
      if ((((char)*piVar2 == 'M') && (*(char *)((long)piVar2 + 1) == 'Z')) ||
         (*piVar2 == 0x464c457f)) {
        lVar6 = 0x10000;
        uVar7 = 0x1000;
        min = 0x11000;
        do {
          pvVar3 = __archive_read_ahead(a,min,&local_38);
          if (pvVar3 == (void *)0x0) {
            uVar7 = (long)uVar7 >> 1;
            if (uVar7 < 0x40) {
              iVar4 = 0;
            }
            bVar1 = (0x3f < uVar7) + 1;
          }
          else {
            uVar5 = (long)pvVar3 + lVar6 + 7;
            piVar2 = (int *)((long)pvVar3 + lVar6);
            while (uVar5 < (ulong)(local_38 + (long)pvVar3)) {
              if (*(int *)((long)piVar2 + 3) == 0x71a21 && *piVar2 == 0x21726152) {
                iVar4 = 0x1e;
                bVar1 = 1;
                goto LAB_001394aa;
              }
              uVar5 = (long)piVar2 + 0x17;
              piVar2 = piVar2 + 4;
            }
            lVar6 = (long)piVar2 - (long)pvVar3;
            bVar1 = 0;
          }
LAB_001394aa:
          if ((bVar1 & 1) != 0) goto LAB_001394c1;
          min = uVar7 + lVar6;
        } while ((long)min < 0x20001);
        bVar1 = 0;
LAB_001394c1:
        if (bVar1 != 0) {
          return iVar4;
        }
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int
archive_read_format_rar_bid(struct archive_read *a, int best_bid)
{
  const char *p;

  /* If there's already a bid > 30, we'll never win. */
  if (best_bid > 30)
	  return (-1);

  if ((p = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (-1);

  if (memcmp(p, RAR_SIGNATURE, 7) == 0)
    return (30);

  if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
    /* This is a PE file */
    ssize_t offset = 0x10000;
    ssize_t window = 4096;
    ssize_t bytes_avail;
    while (offset + window <= (1024 * 128)) {
      const char *buff = __archive_read_ahead(a, offset + window, &bytes_avail);
      if (buff == NULL) {
        /* Remaining bytes are less than window. */
        window >>= 1;
        if (window < 0x40)
          return (0);
        continue;
      }
      p = buff + offset;
      while (p + 7 < buff + bytes_avail) {
        if (memcmp(p, RAR_SIGNATURE, 7) == 0)
          return (30);
        p += 0x10;
      }
      offset = p - buff;
    }
  }
  return (0);
}